

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O2

void __thiscall
cmCommandLineArgument<bool(std::__cxx11::string_const&)>::
cmCommandLineArgument<(anonymous_namespace)::do_build(int,char_const*const*)::__4&>
          (cmCommandLineArgument<bool(std::__cxx11::string_const&)> *this,string *n,Values t,
          anon_class_24_3_a7ad77a2 *func)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  undefined4 in_register_00000014;
  undefined8 *puVar3;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000014,t);
  cmStrCat<char_const(&)[24],std::__cxx11::string&>
            ((string *)this,(char (*) [24])" is invalid syntax for ",n);
  cmStrCat<char_const(&)[25],std::__cxx11::string&>
            ((string *)(this + 0x20),(char (*) [25])"Invalid value used with ",n);
  std::__cxx11::string::string((string *)(this + 0x40),(string *)n);
  *(undefined4 *)(this + 0x60) = 4;
  *(undefined8 *)(this + 100) = 0;
  *(undefined8 *)(this + 0x6c) = 0;
  *(undefined8 *)(this + 0x74) = 0;
  *(undefined8 *)(this + 0x7c) = 0;
  *(undefined4 *)(this + 0x84) = 0;
  puVar2 = (undefined8 *)operator_new(0x18);
  puVar2[2] = puVar3[2];
  uVar1 = puVar3[1];
  *puVar2 = *puVar3;
  puVar2[1] = uVar1;
  *(undefined8 **)(this + 0x68) = puVar2;
  *(code **)(this + 0x80) =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmakemain.cxx:468:23)>
       ::_M_invoke;
  *(code **)(this + 0x78) =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmakemain.cxx:468:23)>
       ::_M_manager;
  return;
}

Assistant:

cmCommandLineArgument(std::string n, Values t, FunctionType&& func)
    : InvalidSyntaxMessage(cmStrCat(" is invalid syntax for ", n))
    , InvalidValueMessage(cmStrCat("Invalid value used with ", n))
    , Name(std::move(n))
    , Type(t)
    , SeparatorNeeded(RequiresSeparator::Yes)
    , StoreCall(std::forward<FunctionType>(func))
  {
  }